

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.c
# Opt level: O3

void assignment(Vm *vm)

{
  size_t length;
  char *name;
  CallFrame **ppCVar1;
  uint8_t instruction;
  Variable VVar2;
  Token local_40;
  
  logic_or(vm);
  if ((vm->compiler).token.type != TOKEN_EQUALS) {
    return;
  }
  length = (vm->compiler).previous.length;
  name = (vm->compiler).previous.start;
  write_code_buffer(&(vm->frames).frame_pointers[vm->frame_count - 1]->code_buffer,'\x1b');
  consume(&local_40,vm,TOKEN_EQUALS,"Expected \'=\' after variable name");
  expr(vm);
  VVar2 = resolve_var(vm,name,length);
  instruction = (uint8_t)VVar2.frame_offset;
  if (((undefined1  [16])VVar2 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
    write_code_buffer(&(vm->frames).frame_pointers[vm->frame_count - 1]->code_buffer,'\x1a');
    if (vm->frame_count == VVar2.frame_offset) {
      ppCVar1 = (vm->frames).frame_pointers + (VVar2.frame_offset - 1);
      instruction = '\x16';
    }
    else {
      write_code_buffer(&(vm->frames).frame_pointers[vm->frame_count - 1]->code_buffer,'\x19');
      ppCVar1 = (vm->frames).frame_pointers + (vm->frame_count - 1);
    }
    write_code_buffer(&(*ppCVar1)->code_buffer,instruction);
    write_code_buffer(&(vm->frames).frame_pointers[vm->frame_count - 1]->code_buffer,
                      (uint8_t)VVar2.index);
    return;
  }
  printf("[Line %d] %s\n",
         (ulong)(vm->compiler).scope[(ulong)((vm->compiler).previous.type != TOKEN_ERROR) * 2 + -8].
                cap,"Cannot reassign val");
  longjmp((__jmp_buf_tag *)error_buf,2);
}

Assistant:

static void assignment(Vm *vm) {
    logic_or(vm);
    Token identifier = vm->compiler.previous;

    if (check(vm, TOKEN_EQUALS)) {
        // TODO remove unnecessary LOAD-POP combination
        emit_no_arg(vm, OP_POP);
        consume(vm, TOKEN_EQUALS, "Expected '=' after variable name");
        expr(vm);
        Variable var = resolve_var(vm, identifier.start, identifier.length);

        if (!var.assignable) {
            error(&vm->compiler, "Cannot reassign val");
        }

        emit_no_arg(vm, OP_DUP);

        if (var.frame_offset != vm->frame_count) {
            // TODO bigger numbers
            emit_short_arg(vm, OP_STORE_OFFSET, (uint8_t) var.frame_offset, (uint8_t) var.index);
        } else {
            emit_byte_arg(vm, OP_STORE, (uint8_t) var.index);
        }
    }
}